

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

void __thiscall QColumnViewPrivate::gripMoved(QColumnViewPrivate *this,int offset)

{
  int iVar1;
  QWidget *this_00;
  QWidgetData *pQVar2;
  LayoutDirection LVar3;
  int iVar4;
  QWidget *pQVar5;
  QWidget *pQVar6;
  pointer piVar7;
  int iVar8;
  bool bVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar5 = (QWidget *)QObject::sender();
  LVar3 = QWidget::layoutDirection(this_00);
  iVar8 = -offset;
  if (LVar3 != RightToLeft) {
    iVar8 = offset;
  }
  if ((this->columns).d.size != 0) {
    uVar10 = 0;
    bVar9 = false;
    do {
      pQVar6 = (QWidget *)(this->columns).d.ptr[uVar10];
      if (bVar9) {
        iVar4 = QWidget::x(pQVar6);
        local_40.xp.m_i = iVar4 + iVar8;
        local_40.yp.m_i = 0;
        QWidget::move((QWidget *)(this->columns).d.ptr[uVar10],&local_40);
        bVar9 = true;
      }
      else {
        pQVar6 = QAbstractScrollArea::cornerWidget((QAbstractScrollArea *)pQVar6);
        if (pQVar6 == pQVar5) {
          pQVar2 = ((this->columns).d.ptr[uVar10]->super_QAbstractScrollArea).super_QFrame.
                   super_QWidget.data;
          iVar4 = (pQVar2->crect).x2.m_i;
          iVar1 = (pQVar2->crect).x1.m_i;
          piVar7 = QList<int>::data(&this->columnSizes);
          piVar7[uVar10] = (iVar4 - iVar1) + 1;
          LVar3 = QWidget::layoutDirection(this_00);
          bVar9 = true;
          if (LVar3 == RightToLeft) {
            pQVar6 = (QWidget *)(this->columns).d.ptr[uVar10];
            iVar4 = QWidget::x(pQVar6);
            local_40.xp.m_i = iVar4 + iVar8;
            local_40.yp.m_i = 0;
            QWidget::move(pQVar6,&local_40);
          }
        }
        else {
          bVar9 = false;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)(this->columns).d.size);
  }
  updateScrollbars(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnViewPrivate::gripMoved(int offset)
{
    Q_Q(QColumnView);

    QObject *grip = q->sender();
    Q_ASSERT(grip);

    if (q->isRightToLeft())
        offset = -1 * offset;

    bool found = false;
    for (int i = 0; i < columns.size(); ++i) {
        if (!found && columns.at(i)->cornerWidget() == grip) {
            found = true;
            columnSizes[i] = columns.at(i)->width();
            if (q->isRightToLeft())
                columns.at(i)->move(columns.at(i)->x() + offset, 0);
            continue;
        }
        if (!found)
            continue;

        int currentX = columns.at(i)->x();
        columns.at(i)->move(currentX + offset, 0);
    }

    updateScrollbars();
}